

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

void __thiscall fasttext::Matrix::addRow(Matrix *this,Vector *vec,int64_t i,real a)

{
  long lVar1;
  real *prVar2;
  real *prVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 in_register_00001204 [12];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                  ,0x47,"void fasttext::Matrix::addRow(const Vector &, int64_t, real)");
  }
  if (i < this->m_) {
    lVar1 = vec->m_;
    if (lVar1 == this->n_) {
      if (0 < lVar1) {
        prVar2 = vec->data_;
        prVar3 = this->data_;
        lVar5 = 0;
        do {
          auVar4._4_12_ = in_register_00001204;
          auVar4._0_4_ = a;
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)prVar2[lVar5]),auVar4,
                                   ZEXT416((uint)prVar3[i * lVar1 + lVar5]));
          prVar3[i * lVar1 + lVar5] = auVar4._0_4_;
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
      return;
    }
    __assert_fail("vec.m_ == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                  ,0x49,"void fasttext::Matrix::addRow(const Vector &, int64_t, real)");
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                ,0x48,"void fasttext::Matrix::addRow(const Vector &, int64_t, real)");
}

Assistant:

void Matrix::addRow(const Vector& vec, int64_t i, real a) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.m_ == n_);
  for (int64_t j = 0; j < n_; j++) {
    data_[i * n_ + j] += a * vec.data_[j];
  }
  /*std::ofstream ofs("matrix.txt", std::ios_base::app);
  for (int64_t i = 0; i < 20; i++) {
    ofs << data_[i] << " ";
  }
  ofs << std::endl;*/
}